

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_aad_x86_64(CPUX86State *env,int base)

{
  uint uVar1;
  
  uVar1 = (uint)env->regs[0];
  uVar1 = (uVar1 >> 8) * base + uVar1 & 0xff;
  *(short *)env->regs = (short)uVar1;
  env->cc_dst = (ulong)uVar1;
  return;
}

Assistant:

void helper_aad(CPUX86State *env, int base)
{
    int al, ah;

    al = env->regs[R_EAX] & 0xff;
    ah = (env->regs[R_EAX] >> 8) & 0xff;
    al = ((ah * base) + al) & 0xff;
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | al;
    CC_DST = al;
}